

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_op_movl_seg_T0_vm(DisasContext *s,int seg_reg)

{
  TCGContext *tcg_ctx;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_ext16u_i64_x86_64(tcg_ctx,s->T0,s->T0);
  tcg_gen_op3_x86_64(tcg_ctx,INDEX_op_st32_i64,(TCGArg)(s->T0 + (long)tcg_ctx),
                     (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(uint)seg_reg * 0x18 + 0xb8);
  tcg_gen_shli_i64_x86_64(tcg_ctx,tcg_ctx->cpu_seg_base[(uint)seg_reg],s->T0,4);
  return;
}

Assistant:

static inline void gen_op_movl_seg_T0_vm(DisasContext *s, int seg_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    tcg_gen_ext16u_tl(tcg_ctx, s->T0, s->T0);
    tcg_gen_st32_tl(tcg_ctx, s->T0, tcg_ctx->cpu_env,
                    offsetof(CPUX86State,segs[seg_reg].selector));
    tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_seg_base[seg_reg], s->T0, 4);
}